

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_logical_operator.cpp
# Opt level: O2

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::LogicalUpdate::Deserialize(LogicalUpdate *this,Deserializer *deserializer)

{
  LogicalUpdate *this_00;
  ClientContext *context;
  pointer pLVar1;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::LogicalUpdate_*,_false> local_28;
  _Head_base<0UL,_duckdb::CreateInfo_*,_false> local_20;
  
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::CreateInfo,std::default_delete<duckdb::CreateInfo>,true>>
            ((Deserializer *)&stack0xffffffffffffffe0,(field_id_t)deserializer,(char *)0xc8);
  this_00 = (LogicalUpdate *)operator_new(0xd0);
  context = SerializationData::Get<duckdb::ClientContext&>(&deserializer->data);
  LogicalUpdate(this_00,context,
                (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *)
                &stack0xffffffffffffffe0);
  local_28._M_head_impl = this_00;
  pLVar1 = unique_ptr<duckdb::LogicalUpdate,_std::default_delete<duckdb::LogicalUpdate>,_true>::
           operator->((unique_ptr<duckdb::LogicalUpdate,_std::default_delete<duckdb::LogicalUpdate>,_true>
                       *)&local_28);
  Deserializer::ReadPropertyWithDefault<unsigned_long>
            (deserializer,0xc9,"table_index",&pLVar1->table_index);
  pLVar1 = unique_ptr<duckdb::LogicalUpdate,_std::default_delete<duckdb::LogicalUpdate>,_true>::
           operator->((unique_ptr<duckdb::LogicalUpdate,_std::default_delete<duckdb::LogicalUpdate>,_true>
                       *)&local_28);
  Deserializer::ReadPropertyWithDefault<bool>
            (deserializer,0xca,"return_chunk",&pLVar1->return_chunk);
  pLVar1 = unique_ptr<duckdb::LogicalUpdate,_std::default_delete<duckdb::LogicalUpdate>,_true>::
           operator->((unique_ptr<duckdb::LogicalUpdate,_std::default_delete<duckdb::LogicalUpdate>,_true>
                       *)&local_28);
  Deserializer::
  ReadPropertyWithDefault<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>>
            (deserializer,0xcb,"expressions",&(pLVar1->super_LogicalOperator).expressions);
  pLVar1 = unique_ptr<duckdb::LogicalUpdate,_std::default_delete<duckdb::LogicalUpdate>,_true>::
           operator->((unique_ptr<duckdb::LogicalUpdate,_std::default_delete<duckdb::LogicalUpdate>,_true>
                       *)&local_28);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<duckdb::PhysicalIndex,true>>
            (deserializer,0xcc,"columns",&pLVar1->columns);
  pLVar1 = unique_ptr<duckdb::LogicalUpdate,_std::default_delete<duckdb::LogicalUpdate>,_true>::
           operator->((unique_ptr<duckdb::LogicalUpdate,_std::default_delete<duckdb::LogicalUpdate>,_true>
                       *)&local_28);
  Deserializer::
  ReadPropertyWithDefault<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>>
            (deserializer,0xcd,"bound_defaults",&pLVar1->bound_defaults);
  pLVar1 = unique_ptr<duckdb::LogicalUpdate,_std::default_delete<duckdb::LogicalUpdate>,_true>::
           operator->((unique_ptr<duckdb::LogicalUpdate,_std::default_delete<duckdb::LogicalUpdate>,_true>
                       *)&local_28);
  Deserializer::ReadPropertyWithDefault<bool>
            (deserializer,0xce,"update_is_del_and_insert",&pLVar1->update_is_del_and_insert);
  (this->super_LogicalOperator)._vptr_LogicalOperator = (_func_int **)local_28._M_head_impl;
  if ((tuple<duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>)local_20._M_head_impl
      != (_Head_base<0UL,_duckdb::CreateInfo_*,_false>)0x0) {
    (**(code **)(*(_func_int **)local_20._M_head_impl + 8))();
  }
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)this;
}

Assistant:

unique_ptr<LogicalOperator> LogicalUpdate::Deserialize(Deserializer &deserializer) {
	auto table_info = deserializer.ReadPropertyWithDefault<unique_ptr<CreateInfo>>(200, "table_info");
	auto result = duckdb::unique_ptr<LogicalUpdate>(new LogicalUpdate(deserializer.Get<ClientContext &>(), table_info));
	deserializer.ReadPropertyWithDefault<idx_t>(201, "table_index", result->table_index);
	deserializer.ReadPropertyWithDefault<bool>(202, "return_chunk", result->return_chunk);
	deserializer.ReadPropertyWithDefault<vector<unique_ptr<Expression>>>(203, "expressions", result->expressions);
	deserializer.ReadPropertyWithDefault<vector<PhysicalIndex>>(204, "columns", result->columns);
	deserializer.ReadPropertyWithDefault<vector<unique_ptr<Expression>>>(205, "bound_defaults", result->bound_defaults);
	deserializer.ReadPropertyWithDefault<bool>(206, "update_is_del_and_insert", result->update_is_del_and_insert);
	return std::move(result);
}